

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  StringRef name;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  XmlWriter *pXVar4;
  undefined4 extraout_var;
  XmlWriter *this_00;
  TestRunInfo *in_RSI;
  StreamingReporterBase *in_RDI;
  StringRef SVar5;
  StringRef SVar6;
  string stylesheetRef;
  string *in_stack_fffffffffffffe98;
  XmlWriter *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  XmlWriter *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  ReporterPreferences *pRVar7;
  allocator<char> *paVar8;
  undefined1 in_stack_ffffffffffffff18 [16];
  StringRef in_stack_ffffffffffffff28;
  allocator<char> local_71;
  string local_70 [64];
  string local_30 [48];
  
  StreamingReporterBase::testRunStarting(in_RDI,in_RSI);
  (*(in_RDI->super_ReporterBase).super_IEventListener._vptr_IEventListener[0x18])(local_30);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    StringRef::StringRef((StringRef *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    SVar5.m_size = (size_type)in_stack_fffffffffffffeb0;
    SVar5.m_start = (char *)in_stack_fffffffffffffea8;
    XmlWriter::writeStylesheetRef(in_stack_fffffffffffffea0,SVar5);
  }
  pRVar7 = &in_RDI[1].super_ReporterBase.super_IEventListener.m_preferences;
  paVar8 = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  operator|(Newline,Indent);
  pXVar4 = XmlWriter::startElement
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                      (XmlFormatting)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  operator____sr(&in_stack_fffffffffffffea0->m_tagIsOpen,(size_t)in_stack_fffffffffffffe98);
  iVar2 = (*((in_RDI->super_ReporterBase).super_IEventListener.m_config)->_vptr_IConfig[3])();
  SVar6.m_start._4_4_ = extraout_var;
  SVar6.m_start._0_4_ = iVar2;
  name.m_size = (size_type)paVar8;
  name.m_start = &pRVar7->shouldRedirectStdOut;
  SVar6.m_size = (size_type)pXVar4;
  XmlWriter::writeAttribute(this_00,name,SVar6);
  operator____sr(&in_stack_fffffffffffffea0->m_tagIsOpen,(size_t)in_stack_fffffffffffffe98);
  (*((in_RDI->super_ReporterBase).super_IEventListener.m_config)->_vptr_IConfig[0x11])();
  XmlWriter::writeAttribute<unsigned_int,void>
            (in_stack_ffffffffffffff18._8_8_,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff18._0_8_);
  operator____sr(&in_stack_fffffffffffffea0->m_tagIsOpen,(size_t)in_stack_fffffffffffffe98);
  XmlWriter::writeAttribute<int,void>
            (in_stack_ffffffffffffff18._8_8_,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff18._0_8_);
  SVar5 = operator____sr(&in_stack_fffffffffffffea0->m_tagIsOpen,(size_t)in_stack_fffffffffffffe98);
  libraryVersion();
  XmlWriter::writeAttribute<Catch::Version,void>
            (in_stack_ffffffffffffff18._8_8_,SVar5,in_stack_ffffffffffffff18._0_8_);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  (*((in_RDI->super_ReporterBase).super_IEventListener.m_config)->_vptr_IConfig[0xd])();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x1adc1b);
  if (bVar1) {
    SVar6 = operator____sr(&in_RDI[1].super_ReporterBase.super_IEventListener.m_preferences.
                            shouldRedirectStdOut,(size_t)in_stack_fffffffffffffe98);
    (*((in_RDI->super_ReporterBase).super_IEventListener.m_config)->_vptr_IConfig[0xd])();
    XmlWriter::writeAttribute<Catch::TestSpec,void>
              ((XmlWriter *)SVar6.m_size,SVar5,(TestSpec *)SVar6.m_start);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlReporter::testRunStarting( TestRunInfo const& testInfo ) {
        StreamingReporterBase::testRunStarting( testInfo );
        std::string stylesheetRef = getStylesheetRef();
        if( !stylesheetRef.empty() )
            m_xml.writeStylesheetRef( stylesheetRef );
        m_xml.startElement("Catch2TestRun")
             .writeAttribute("name"_sr, m_config->name())
             .writeAttribute("rng-seed"_sr, m_config->rngSeed())
             .writeAttribute("xml-format-version"_sr, 3)
             .writeAttribute("catch2-version"_sr, libraryVersion());
        if ( m_config->testSpec().hasFilters() ) {
            m_xml.writeAttribute( "filters"_sr, m_config->testSpec() );
        }
    }